

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O3

void __thiscall embree::OBJLoader::loadMTL(OBJLoader *this,FileName *fileName)

{
  byte bVar1;
  pointer pcVar2;
  double dVar3;
  long lVar4;
  undefined8 uVar5;
  size_type sVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *pmVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  __fd_mask *p_Var13;
  mapped_type *pmVar14;
  runtime_error *prVar15;
  ostream *poVar16;
  __fd_mask *in_RCX;
  fd_set *__readfds;
  fd_set *__readfds_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  _Alloc_hider _Var18;
  fd_set *in_R8;
  timeval *in_R9;
  __fd_mask *p_Var19;
  byte *pbVar20;
  float fVar21;
  string line;
  string name;
  string next_line;
  ifstream cin;
  __fd_mask *local_4e8 [2];
  undefined1 local_4d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  bool local_4b0 [16];
  key_type local_4a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *local_480;
  undefined8 local_478;
  float local_470;
  float fStack_46c;
  float local_468 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  undefined1 local_438 [152];
  element_type *local_3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_398;
  float local_390;
  undefined8 local_38c;
  undefined8 uStack_384;
  undefined8 local_37c;
  undefined1 local_374 [28];
  ExtObjMaterial local_358;
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cannot open ",0xc);
    pcVar2 = (fileName->filename)._M_dataplus._M_p;
    local_358._0_8_ = (char *)((long)&local_358 + 0x10U);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_358._0_8_,local_358._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    _Var18._M_p = (pointer)local_358._0_8_;
    if ((char *)local_358._0_8_ == (char *)((long)&local_358 + 0x10U)) goto LAB_00140415;
  }
  else {
    local_4a0._M_dataplus._M_p = local_4d8 + 0x48;
    local_4a0._M_string_length = 0;
    local_4a0.field_2._M_local_buf[0] = 0;
    local_358._0_8_ = (char *)0x0;
    local_358.d = 1.0;
    local_358.Ns = 1.0;
    local_358.Ni = 1.0;
    local_358.Ka.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    local_358.Kd.field_0._8_8_ = 0x3f8000003f800000;
    local_358.Kd.field_0._0_8_ = 0x3f8000003f800000;
    local_358.roughnessMap.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_358.roughnessMap.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    memset(&local_358.Ks.field_0,0,0x94);
    local_358.coat_eta = 1.0;
    local_358.coat_roughness = 0.0;
    local_358.coat_roughnessMap.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = 0;
    local_358.coat_roughnessMap.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._4_4_ = 0;
    local_358.coat_roughnessMap.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 0;
    local_358.coat_roughnessMap.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 0;
    local_358.bump = 0.0;
    local_358.eta.field_0._0_8_ = (MaterialNode *)0x3fb333333fb33333;
    local_358.eta.field_0.field_0.z = 1.4;
    local_358.k.field_0._0_8_ = (MaterialNode *)0x4040000040400000;
    local_358.k.field_0.field_0.z = 3.0;
    local_480 = &this->material;
    local_4d8._16_8_ = this;
    while( true ) {
      iVar10 = std::istream::peek();
      if (iVar10 == -1) break;
      local_4c0._8_8_ = 0;
      local_4b0[0] = false;
      cVar8 = (char)(istream *)local_238;
      local_4c0._M_allocated_capacity = (size_type)(local_4d8 + 0x28);
      cVar9 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)(local_4d8 + 0x18),cVar9);
      do {
        if ((local_4c0._8_8_ == 0) ||
           (((char *)(local_4c0._M_allocated_capacity - 1))[local_4c0._8_8_] != '\\')) break;
        ((char *)(local_4c0._M_allocated_capacity - 1))[local_4c0._8_8_] = ' ';
        local_470 = 0.0;
        fStack_46c = 0.0;
        local_468[0] = (float)((uint)local_468[0] & 0xffffff00);
        local_478 = (MaterialNode *)local_468;
        cVar9 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_478,cVar9);
        lVar4 = CONCAT44(fStack_46c,local_470);
        if (lVar4 != 0) {
          std::__cxx11::string::_M_append(local_4d8 + 0x18,(ulong)local_478);
        }
        if (local_478 != (MaterialNode *)local_468) {
          operator_delete(local_478);
        }
      } while (lVar4 != 0);
      uVar5 = local_4c0._M_allocated_capacity;
      sVar12 = strspn((char *)local_4c0._M_allocated_capacity," \t");
      local_4e8[0] = (__fd_mask *)(uVar5 + sVar12);
      p_Var19 = local_4e8[0];
      if (*(char *)(uVar5 + sVar12) != '\0') {
        do {
          p_Var13 = p_Var19;
          p_Var19 = (__fd_mask *)((long)p_Var13 + 1);
        } while (*(byte *)((long)p_Var13 + 1) != 0);
        for (; ((in_RCX = (__fd_mask *)(ulong)(byte)*p_Var13, in_RCX < (__fd_mask *)0x21 &&
                ((0x100002200U >> ((ulong)in_RCX & 0x3f) & 1) != 0)) && (local_4e8[0] <= p_Var13));
            p_Var13 = (__fd_mask *)((long)p_Var13 + -1)) {
          *(byte *)p_Var13 = 0;
        }
      }
      if (((byte)*local_4e8[0] != 0) && ((byte)*local_4e8[0] != 0x23)) {
        iVar10 = strncmp((char *)local_4e8[0],"newmtl",6);
        iVar11 = std::__cxx11::string::compare(local_4d8 + 0x38);
        p_Var19 = local_4e8[0];
        if (iVar10 == 0) {
          if (iVar11 != 0) {
            ExtObjMaterial::select
                      ((ExtObjMaterial *)&local_478,(int)&local_358,__readfds,(fd_set *)in_RCX,in_R8
                       ,in_R9);
            pmVar7 = local_480;
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                      ::operator[](local_480,(key_type *)(local_4d8 + 0x38));
            if (pmVar14->ptr != (MaterialNode *)0x0) {
              (*(pmVar14->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            pmVar14->ptr = local_478;
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                      ::operator[](pmVar7,(key_type *)(local_4d8 + 0x38));
            std::__cxx11::string::_M_assign((string *)&(pmVar14->ptr->super_Node).name);
          }
          in_RCX = (__fd_mask *)((long)local_4e8[0] + 6);
          local_4e8[0] = in_RCX;
          sVar12 = strspn((char *)in_RCX," \t");
          sVar6 = local_4a0._M_string_length;
          if (sVar12 == 0) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar15,"separator expected");
            goto LAB_00140510;
          }
          in_RCX = (__fd_mask *)((long)in_RCX + sVar12);
          local_4e8[0] = in_RCX;
          in_R8 = (fd_set *)strlen((char *)in_RCX);
          std::__cxx11::string::_M_replace((ulong)(local_4d8 + 0x38),0,(char *)sVar6,(ulong)in_RCX);
          memset((ExtObjMaterial *)&local_478,0,0x120);
          local_470 = 1.0;
          fStack_46c = 1.0;
          local_468[0] = 1.0;
          local_448._M_allocated_capacity = 0x3f8000003f800000;
          local_448._8_8_ = 0x3f8000003f800000;
          local_3a0 = (element_type *)0x0;
          _Stack_398._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          memset(local_438,0,0x94);
          local_390 = 1.0;
          local_38c = 0;
          uStack_384 = 0;
          local_37c = 0;
          local_374._0_8_ = 0x3fb333333fb33333;
          local_374._8_8_ = 0x404000003fb33333;
          local_374._16_8_ = 0x4040000040400000;
          ExtObjMaterial::operator=(&local_358,(ExtObjMaterial *)&local_478);
          ExtObjMaterial::~ExtObjMaterial((ExtObjMaterial *)&local_478);
        }
        else {
          if (iVar11 == 0) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar15,"invalid material file: newmtl expected first");
LAB_00140510:
            __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar10 = strncmp((char *)local_4e8[0],"illum",5);
          if (iVar10 == 0) {
            local_4e8[0] = (__fd_mask *)((long)p_Var19 + 5);
            sVar12 = strspn((char *)local_4e8[0]," \t");
            if (sVar12 == 0) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar15,"separator expected");
              goto LAB_001401c4;
            }
          }
          else {
            bVar1 = (byte)*p_Var19;
            if (bVar1 == 0x4e) {
              if (*(byte *)((long)p_Var19 + 1) == 0x73) {
                p_Var19 = (__fd_mask *)((long)p_Var19 + 2);
                local_4e8[0] = p_Var19;
                sVar12 = strspn((char *)p_Var19," \t");
                if (sVar12 == 0) {
                  prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar15,"separator expected");
                  goto LAB_001401c4;
                }
                pbVar20 = (byte *)((long)p_Var19 + sVar12);
                local_4e8[0] = (__fd_mask *)pbVar20;
                sVar12 = strspn((char *)pbVar20," \t");
                local_4e8[0] = (__fd_mask *)(pbVar20 + sVar12);
                dVar3 = atof((char *)local_4e8[0]);
                local_358.Ns = (float)dVar3;
              }
              else {
                if (*(byte *)((long)p_Var19 + 1) != 0x69) goto LAB_0013f42b;
                p_Var19 = (__fd_mask *)((long)p_Var19 + 2);
                local_4e8[0] = p_Var19;
                sVar12 = strspn((char *)p_Var19," \t");
                if (sVar12 == 0) {
                  prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar15,"separator expected");
                  goto LAB_001401c4;
                }
                pbVar20 = (byte *)((long)p_Var19 + sVar12);
                local_4e8[0] = (__fd_mask *)pbVar20;
                sVar12 = strspn((char *)pbVar20," \t");
                local_4e8[0] = (__fd_mask *)(pbVar20 + sVar12);
                dVar3 = atof((char *)local_4e8[0]);
                local_358.Ni = (float)dVar3;
              }
            }
            else if (bVar1 == 100) {
              p_Var19 = (__fd_mask *)((long)p_Var19 + 1);
              local_4e8[0] = p_Var19;
              sVar12 = strspn((char *)p_Var19," \t");
              if (sVar12 == 0) {
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar15,"separator expected");
                goto LAB_001401c4;
              }
              pbVar20 = (byte *)((long)p_Var19 + sVar12);
              local_4e8[0] = (__fd_mask *)pbVar20;
              sVar12 = strspn((char *)pbVar20," \t");
              local_4e8[0] = (__fd_mask *)(pbVar20 + sVar12);
              dVar3 = atof((char *)local_4e8[0]);
              local_358.d = (float)dVar3;
            }
            else {
LAB_0013f42b:
              iVar10 = strncmp((char *)p_Var19,"map_d",5);
              if (iVar10 == 0) {
LAB_0013f64b:
                p_Var19 = (__fd_mask *)((long)p_Var19 + 5);
                local_4e8[0] = p_Var19;
                sVar12 = strspn((char *)p_Var19," \t");
                if (sVar12 == 0) {
                  prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar15,"separator expected");
LAB_001401c4:
                  __cxa_throw(prVar15,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_4e8[0] = (__fd_mask *)((long)p_Var19 + sVar12);
                FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
                _Var17._M_pi = local_358.map_d.
                               super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                local_358.map_d.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)local_4d8._0_8_;
                local_358.map_d.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_;
              }
              else {
                iVar10 = strncmp((char *)p_Var19,"d_map",5);
                if (iVar10 == 0) goto LAB_0013f64b;
                iVar10 = strncmp((char *)p_Var19,"map_Ka",6);
                if (iVar10 == 0) {
LAB_0013f6b6:
                  p_Var19 = (__fd_mask *)((long)p_Var19 + 6);
                  local_4e8[0] = p_Var19;
                  sVar12 = strspn((char *)p_Var19," \t");
                  if (sVar12 == 0) {
                    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar15,"separator expected");
                    goto LAB_001401c4;
                  }
                  local_4e8[0] = (__fd_mask *)((long)p_Var19 + sVar12);
                  FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                  loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
                  _Var17._M_pi = local_358.map_Ka.
                                 super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                  local_358.map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)local_4d8._0_8_;
                  local_358.map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_;
                }
                else {
                  iVar10 = strncmp((char *)p_Var19,"Ka_map",6);
                  if (iVar10 == 0) goto LAB_0013f6b6;
                  iVar10 = strncmp((char *)p_Var19,"map_Kd",6);
                  if (iVar10 == 0) {
LAB_0013f721:
                    p_Var19 = (__fd_mask *)((long)p_Var19 + 6);
                    local_4e8[0] = p_Var19;
                    sVar12 = strspn((char *)p_Var19," \t");
                    if (sVar12 == 0) {
                      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar15,"separator expected");
                      goto LAB_001401c4;
                    }
                    local_4e8[0] = (__fd_mask *)((long)p_Var19 + sVar12);
                    FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                    loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
                    _Var17._M_pi = local_358.map_Kd.
                                   super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi;
                    local_358.map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)local_4d8._0_8_;
                    local_358.map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_;
                  }
                  else {
                    iVar10 = strncmp((char *)p_Var19,"Kd_map",6);
                    if (iVar10 == 0) goto LAB_0013f721;
                    iVar10 = strncmp((char *)p_Var19,"map_Ks",6);
                    if (iVar10 == 0) {
LAB_0013f78c:
                      local_4e8[0] = (__fd_mask *)((long)p_Var19 + 6);
                      parseSep((char **)local_4e8);
                      FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                      loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
                      _Var17._M_pi = local_358.map_Ks.
                                     super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                      local_358.map_Ks.
                      super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)local_4d8._0_8_;
                      local_358.map_Ks.
                      super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_;
                    }
                    else {
                      iVar10 = strncmp((char *)p_Var19,"Ks_map",6);
                      if (iVar10 == 0) goto LAB_0013f78c;
                      iVar10 = strncmp((char *)p_Var19,"map_Kt",6);
                      if (iVar10 == 0) {
LAB_0013f7e1:
                        local_4e8[0] = (__fd_mask *)((long)p_Var19 + 6);
                        parseSep((char **)local_4e8);
                        FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                        loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
LAB_0013f849:
                        _Var17._M_pi = local_358.map_Kt.
                                       super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                        local_358.map_Kt.
                        super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)local_4d8._0_8_;
                        local_358.map_Kt.
                        super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_;
                      }
                      else {
                        iVar10 = strncmp((char *)p_Var19,"Kt_map",6);
                        if (iVar10 == 0) goto LAB_0013f7e1;
                        iVar10 = strncmp((char *)p_Var19,"map_Tf",6);
                        if (iVar10 == 0) {
LAB_0013f816:
                          local_4e8[0] = (__fd_mask *)((long)p_Var19 + 6);
                          parseSep((char **)local_4e8);
                          FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                          loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
                          goto LAB_0013f849;
                        }
                        iVar10 = strncmp((char *)p_Var19,"Tf_map",6);
                        if (iVar10 == 0) goto LAB_0013f816;
                        iVar10 = strncmp((char *)p_Var19,"map_Ns",6);
                        if (iVar10 == 0) {
LAB_0013f8a6:
                          local_4e8[0] = (__fd_mask *)((long)p_Var19 + 6);
                          parseSep((char **)local_4e8);
                          FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                          loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
                          local_358.map_Ns.
                          super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                               (element_type *)local_4d8._0_8_;
                          _Var17._M_pi = local_358.map_Ns.
                                         super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                          local_358.map_Ns.
                          super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi =
                               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_;
                        }
                        else {
                          iVar10 = strncmp((char *)p_Var19,"Ns_map",6);
                          if (iVar10 == 0) goto LAB_0013f8a6;
                          iVar10 = strncmp((char *)p_Var19,"map_Displ",9);
                          if (iVar10 != 0) {
                            iVar10 = strncmp((char *)p_Var19,"Displ_map",9);
                            if (iVar10 != 0) {
                              if (bVar1 == 0x54) {
                                if (*(byte *)((long)p_Var19 + 1) != 0x66) goto LAB_0013fa26;
                                local_4e8[0] = (__fd_mask *)((long)p_Var19 + 2);
                                parseSep((char **)local_4e8);
LAB_0013f970:
                                getVec3f((embree *)&local_478,(char **)local_4e8);
                                local_358.Kt.field_0.m128[2] = local_470;
                                local_358.Kt.field_0._0_8_ = local_478;
                                local_358.Kt.field_0.m128[3] = 0.0;
                              }
                              else if (bVar1 == 0x4b) {
                                if (*(byte *)((long)p_Var19 + 1) == 0x61) {
                                  local_4e8[0] = (__fd_mask *)((long)p_Var19 + 2);
                                  parseSep((char **)local_4e8);
                                  getVec3f((embree *)&local_478,(char **)local_4e8);
                                  local_358.Ka.field_0.m128[2] = local_470;
                                  local_358.Ka.field_0._0_8_ = local_478;
                                  local_358.Ka.field_0.m128[3] = 0.0;
                                }
                                else {
                                  if (*(byte *)((long)p_Var19 + 1) == 100) {
                                    local_4e8[0] = (__fd_mask *)((long)p_Var19 + 2);
                                    parseSep((char **)local_4e8);
                                    goto LAB_0013fd9e;
                                  }
                                  if (*(byte *)((long)p_Var19 + 1) != 0x73) {
                                    if (*(byte *)((long)p_Var19 + 1) == 0x74) {
                                      local_4e8[0] = (__fd_mask *)((long)p_Var19 + 2);
                                      parseSep((char **)local_4e8);
                                      goto LAB_0013f970;
                                    }
                                    goto LAB_0013fa26;
                                  }
                                  local_4e8[0] = (__fd_mask *)((long)p_Var19 + 2);
                                  parseSep((char **)local_4e8);
                                  getVec3f((embree *)&local_478,(char **)local_4e8);
                                  local_358.Ks.field_0.m128[2] = local_470;
                                  local_358.Ks.field_0._0_8_ = local_478;
                                  local_358.Ks.field_0.m128[3] = 0.0;
                                }
                              }
                              else {
LAB_0013fa26:
                                iVar10 = strncmp((char *)p_Var19,"type",4);
                                if (iVar10 == 0) {
                                  local_4e8[0] = (__fd_mask *)((long)p_Var19 + 4);
                                  parseSep((char **)local_4e8);
                                  std::__cxx11::string::string
                                            ((string *)&local_478,(char *)local_4e8[0],
                                             (allocator *)local_4d8);
                                  iVar10 = std::__cxx11::string::compare((char *)&local_478);
                                  if (iVar10 == 0) {
                                    local_358.type = 1;
                                  }
                                  else {
                                    iVar10 = std::__cxx11::string::compare((char *)&local_478);
                                    if (iVar10 == 0) {
                                      local_358.type = 2;
                                    }
                                    else {
                                      iVar10 = std::__cxx11::string::compare((char *)&local_478);
                                      if (iVar10 == 0) {
                                        local_358.type = 3;
                                      }
                                      else {
                                        iVar10 = std::__cxx11::string::compare((char *)&local_478);
                                        if (iVar10 == 0) {
                                          local_358.type = 4;
                                        }
                                        else {
                                          iVar10 = std::__cxx11::string::compare((char *)&local_478)
                                          ;
                                          if (iVar10 != 0) {
                                            iVar10 = std::__cxx11::string::compare
                                                               ((char *)&local_478);
                                            if (iVar10 != 0) goto LAB_0013ff25;
                                          }
                                          local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  iVar10 = strncmp((char *)p_Var19,"baseColor",9);
                                  if (iVar10 == 0) {
                                    local_4e8[0] = (__fd_mask *)((long)p_Var19 + 9);
                                    parseSep((char **)local_4e8);
                                    goto LAB_0013fd9e;
                                  }
                                  if (((bVar1 == 0x69) && (*(byte *)((long)p_Var19 + 1) == 0x6f)) &&
                                     (*(byte *)((long)p_Var19 + 2) == 0x72)) {
                                    local_4e8[0] = (__fd_mask *)((long)p_Var19 + 3);
                                    parseSep((char **)local_4e8);
                                    local_358.Ni = getFloat((char **)local_4e8);
                                    goto LAB_0013f88e;
                                  }
                                  iVar10 = strncmp((char *)p_Var19,"map_baseColor",0xd);
                                  if (iVar10 == 0) {
                                    local_4e8[0] = (__fd_mask *)((long)p_Var19 + 0xd);
                                    parseSep((char **)local_4e8);
                                    FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                                    loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_)
                                    ;
LAB_0013fe08:
                                    _Var17._M_pi = local_358.map_Kd.
                                                                                                      
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                    local_358.map_Kd.
                                    super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr = (element_type *)local_4d8._0_8_;
                                    local_358.map_Kd.
                                    super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi =
                                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_4d8._8_8_;
                                  }
                                  else {
                                    iVar10 = strncmp((char *)p_Var19,"map_specular",0xc);
                                    if (iVar10 != 0) {
                                      iVar10 = strncmp((char *)p_Var19,"map_normal.scale",0x10);
                                      if (iVar10 == 0) {
                                        local_4e8[0] = p_Var19 + 2;
                                        parseSep((char **)local_4e8);
                                      }
                                      else {
                                        iVar10 = strncmp((char *)p_Var19,"map_normal",10);
                                        if (iVar10 == 0) {
                                          local_4e8[0] = (__fd_mask *)((long)p_Var19 + 10);
                                          parseSep((char **)local_4e8);
                                          FileName::FileName((FileName *)&local_478,
                                                             (char *)local_4e8[0]);
                                          loadTexture((OBJLoader *)local_4d8,
                                                      (FileName *)local_4d8._16_8_);
LAB_0013feef:
                                          _Var17._M_pi = local_358.map_Displ.
                                                                                                                  
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                          local_358.map_Displ.
                                          super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr = (element_type *)local_4d8._0_8_;
                                          local_358.map_Displ.
                                          super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi =
                                               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                               local_4d8._8_8_;
                                          goto LAB_0013ff0c;
                                        }
                                        iVar10 = strncmp((char *)p_Var19,"transmissionColor",0x11);
                                        if (iVar10 == 0) {
                                          local_4e8[0] = (__fd_mask *)((long)p_Var19 + 0x11);
                                          parseSep((char **)local_4e8);
                                          goto LAB_0013f970;
                                        }
                                        iVar10 = strncmp((char *)p_Var19,"transmission",0xc);
                                        if (iVar10 == 0) {
                                          local_4e8[0] = (__fd_mask *)((long)p_Var19 + 0xc);
                                          parseSep((char **)local_4e8);
                                          fVar21 = getFloat((char **)local_4e8);
                                          local_358.Kt.field_0.m128[1] = fVar21;
                                          local_358.Kt.field_0.m128[0] = fVar21;
                                          local_358.Kt.field_0.m128[2] = fVar21;
                                          local_358.Kt.field_0.m128[3] = 0.0;
                                        }
                                        else {
                                          iVar10 = strncmp((char *)p_Var19,"roughnessMap",0xc);
                                          if (iVar10 == 0) {
                                            local_4e8[0] = (__fd_mask *)((long)p_Var19 + 0xc);
                                            parseSep((char **)local_4e8);
                                            FileName::FileName((FileName *)&local_478,
                                                               (char *)local_4e8[0]);
                                            loadTexture((OBJLoader *)local_4d8,
                                                        (FileName *)local_4d8._16_8_);
                                            local_358.roughnessMap.
                                            super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)local_4d8._0_8_;
                                            _Var17._M_pi = local_358.roughnessMap.
                                                                                                                      
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                            local_358.roughnessMap.
                                            super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                 local_4d8._8_8_;
                                            goto LAB_0013ff0c;
                                          }
                                          iVar10 = strncmp((char *)p_Var19,"roughness",9);
                                          if (iVar10 == 0) {
                                            local_4e8[0] = (__fd_mask *)((long)p_Var19 + 9);
                                            parseSep((char **)local_4e8);
                                            local_358.roughness = getFloat((char **)local_4e8);
                                            local_358.Ns = 1.0 / (local_358.roughness + 1e-06);
                                          }
                                          else {
                                            iVar10 = strncmp((char *)p_Var19,"colorMap",8);
                                            if (iVar10 == 0) {
                                              local_4e8[0] = p_Var19 + 1;
                                              parseSep((char **)local_4e8);
                                              FileName::FileName((FileName *)&local_478,
                                                                 (char *)local_4e8[0]);
                                              loadTexture((OBJLoader *)local_4d8,
                                                          (FileName *)local_4d8._16_8_);
                                              goto LAB_0013fe08;
                                            }
                                            iVar10 = strncmp((char *)p_Var19,"color",5);
                                            if (iVar10 == 0) {
                                              local_4e8[0] = (__fd_mask *)((long)p_Var19 + 5);
                                              parseSep((char **)local_4e8);
                                            }
                                            else {
                                              iVar10 = strncmp((char *)p_Var19,"coat.color",10);
                                              if (iVar10 != 0) {
                                                iVar10 = strncmp((char *)p_Var19,"coat.eta",8);
                                                if (iVar10 == 0) {
                                                  local_4e8[0] = p_Var19 + 1;
                                                  parseSep((char **)local_4e8);
                                                  local_358.coat_eta = getFloat((char **)local_4e8);
                                                }
                                                else {
                                                  iVar10 = strncmp((char *)p_Var19,
                                                                   "coat.roughnessMap",0x11);
                                                  if (iVar10 == 0) {
                                                    local_4e8[0] = (__fd_mask *)
                                                                   ((long)p_Var19 + 0x11);
                                                    parseSep((char **)local_4e8);
                                                    FileName::FileName((FileName *)&local_478,
                                                                       (char *)local_4e8[0]);
                                                    loadTexture((OBJLoader *)local_4d8,
                                                                (FileName *)local_4d8._16_8_);
                                                    _Var17._M_pi = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  CONCAT44(local_358.coat_roughnessMap.
                                                                                                                      
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._4_4_,
                                                  local_358.coat_roughnessMap.
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._0_4_);
                                                  local_358.coat_roughnessMap.
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_ = (undefined4)local_4d8._0_8_;
                                                  local_358.coat_roughnessMap.
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_ = SUB84(local_4d8._0_8_,4);
                                                  local_358.coat_roughnessMap.
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._0_4_ =
                                                       (undefined4)local_4d8._8_8_;
                                                  local_358.coat_roughnessMap.
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._4_4_ =
                                                       SUB84(local_4d8._8_8_,4);
                                                  goto LAB_0013ff0c;
                                                  }
                                                  iVar10 = strncmp((char *)p_Var19,"coat.roughness",
                                                                   0xe);
                                                  if (iVar10 == 0) {
                                                    local_4e8[0] = (__fd_mask *)
                                                                   ((long)p_Var19 + 0xe);
                                                    parseSep((char **)local_4e8);
                                                    local_358.coat_roughness =
                                                         getFloat((char **)local_4e8);
                                                  }
                                                  else {
                                                    iVar10 = strncmp((char *)p_Var19,"bumpMap",7);
                                                    if (iVar10 == 0) {
                                                      local_4e8[0] = (__fd_mask *)
                                                                     ((long)p_Var19 + 7);
                                                      parseSep((char **)local_4e8);
                                                      FileName::FileName((FileName *)&local_478,
                                                                         (char *)local_4e8[0]);
                                                      loadTexture((OBJLoader *)local_4d8,
                                                                  (FileName *)local_4d8._16_8_);
                                                      goto LAB_0013feef;
                                                    }
                                                    iVar10 = strncmp((char *)p_Var19,"bump",4);
                                                    if (iVar10 == 0) {
                                                      local_4e8[0] = (__fd_mask *)
                                                                     ((long)p_Var19 + 4);
                                                      parseSep((char **)local_4e8);
                                                      local_358.bump = getFloat((char **)local_4e8);
                                                    }
                                                    else if (bVar1 == 0x6b) {
                                                      local_4e8[0] = (__fd_mask *)
                                                                     ((long)p_Var19 + 1);
                                                      parseSep((char **)local_4e8);
                                                      getVec3f((embree *)&local_478,
                                                               (char **)local_4e8);
                                                      local_358.k.field_0.field_0.z = local_470;
                                                      local_358.k.field_0._0_8_ = local_478;
                                                    }
                                                    else if (((bVar1 == 0x65) &&
                                                             (*(byte *)((long)p_Var19 + 1) == 0x74))
                                                            && (*(byte *)((long)p_Var19 + 2) == 0x61
                                                               )) {
                                                      local_4e8[0] = (__fd_mask *)
                                                                     ((long)p_Var19 + 3);
                                                      parseSep((char **)local_4e8);
                                                      getVec3f((embree *)&local_478,
                                                               (char **)local_4e8);
                                                      local_358.eta.field_0._0_8_ = local_478;
                                                      local_358.eta.field_0.field_0.z = local_470;
                                                    }
                                                  }
                                                }
                                                goto LAB_0013f88e;
                                              }
                                              local_4e8[0] = (__fd_mask *)((long)p_Var19 + 10);
                                              parseSep((char **)local_4e8);
                                            }
LAB_0013fd9e:
                                            getVec3f((embree *)&local_478,(char **)local_4e8);
                                            local_358.Kd.field_0.m128[2] = local_470;
                                            local_358.Kd.field_0._0_8_ = local_478;
                                            local_358.Kd.field_0.m128[3] = 0.0;
                                          }
                                        }
                                      }
                                      goto LAB_0013f88e;
                                    }
                                    local_4e8[0] = (__fd_mask *)((long)p_Var19 + 0xc);
                                    parseSep((char **)local_4e8);
                                    FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                                    loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_)
                                    ;
                                    _Var17._M_pi = local_358.map_Ks.
                                                                                                      
                                                  super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                    local_358.map_Ks.
                                    super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr = (element_type *)local_4d8._0_8_;
                                    local_358.map_Ks.
                                    super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi =
                                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_4d8._8_8_;
                                  }
LAB_0013ff0c:
                                  local_4d8._8_8_ =
                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                  local_4d8._0_8_ = (GroupNode *)0x0;
                                  if (_Var17._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (_Var17._M_pi);
                                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_4d8._8_8_ !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                 local_4d8._8_8_);
                                    }
                                  }
                                }
LAB_0013ff25:
                                if (local_478 != (MaterialNode *)local_468) {
                                  operator_delete(local_478);
                                }
                              }
                              goto LAB_0013f88e;
                            }
                          }
                          local_4e8[0] = (__fd_mask *)((long)p_Var19 + 9);
                          parseSep((char **)local_4e8);
                          FileName::FileName((FileName *)&local_478,(char *)local_4e8[0]);
                          loadTexture((OBJLoader *)local_4d8,(FileName *)local_4d8._16_8_);
                          local_358.map_Displ.
                          super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                               (element_type *)local_4d8._0_8_;
                          _Var17._M_pi = local_358.map_Displ.
                                         super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                          local_358.map_Displ.
                          super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi =
                               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_;
                        }
                      }
                    }
                  }
                }
              }
              local_4d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_4d8._0_8_ = (GroupNode *)0x0;
              if (_Var17._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var17._M_pi);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_);
                }
              }
              if (local_478 != (MaterialNode *)local_468) {
                operator_delete(local_478);
              }
            }
          }
        }
      }
LAB_0013f88e:
      if ((undefined1 *)local_4c0._M_allocated_capacity != local_4d8 + 0x28) {
        operator_delete((void *)local_4c0._M_allocated_capacity);
      }
    }
    iVar10 = std::__cxx11::string::compare(local_4d8 + 0x38);
    if (iVar10 != 0) {
      ExtObjMaterial::select
                ((ExtObjMaterial *)&local_478,(int)&local_358,__readfds_00,(fd_set *)in_RCX,in_R8,
                 in_R9);
      pmVar7 = local_480;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                ::operator[](local_480,(key_type *)(local_4d8 + 0x38));
      if (pmVar14->ptr != (MaterialNode *)0x0) {
        (*(pmVar14->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar14->ptr = local_478;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                ::operator[](pmVar7,(key_type *)(local_4d8 + 0x38));
      std::__cxx11::string::_M_assign((string *)&(pmVar14->ptr->super_Node).name);
    }
    std::ifstream::close();
    ExtObjMaterial::~ExtObjMaterial(&local_358);
    _Var18._M_p = local_4a0._M_dataplus._M_p;
    if (local_4a0._M_dataplus._M_p == local_4d8 + 0x48) goto LAB_00140415;
  }
  operator_delete(_Var18._M_p);
LAB_00140415:
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void OBJLoader::loadMTL(const FileName &fileName)
  {
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      std::cerr << "cannot open " << fileName.str() << std::endl;
      return;
    }

    std::string name;
    ExtObjMaterial cur;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));

      if (token[0] == 0  ) continue; // ignore empty lines
      if (token[0] == '#') continue; // ignore comments

      if (!strncmp(token, "newmtl", 6)) 
      {
        if (name != "") {
          material[name] = cur.select();
          material[name]->name = name;
        }
        
        parseSep(token+=6);
        name = token;
        cur = ExtObjMaterial();
        continue;
      }
      if (name == "") THROW_RUNTIME_ERROR("invalid material file: newmtl expected first");
      
      try 
      {
        if (!strncmp(token, "illum", 5)) { parseSep(token += 5);  continue; }
        
        if (!strncmp(token, "d",  1)) { parseSep(token += 1);  cur.d  = getFloat(token); continue; }
        if (!strncmp(token, "Ns", 2)) { parseSep(token += 2);  cur.Ns = getFloat(token); continue; }
        if (!strncmp(token, "Ni", 2)) { parseSep(token += 2);  cur.Ni = getFloat(token); continue; }
        
        if (!strncmp(token, "map_d", 5) || !strncmp(token, "d_map", 5)) {
          parseSep(token += 5);
          cur.map_d = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ka", 6) || !strncmp(token, "Ka_map", 6)) {
          parseSep(token += 6);
          cur.map_Ka = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kd", 6) || !strncmp(token, "Kd_map", 6)) {
          parseSep(token += 6);
          cur.map_Kd = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ks", 6) || !strncmp(token, "Ks_map", 6)) {
          parseSep(token += 6);
          cur.map_Ks = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kt", 6) || !strncmp(token, "Kt_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Tf", 6) || !strncmp(token, "Tf_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ns", 6) || !strncmp(token, "Ns_map", 6)) {
          parseSep(token += 6);
          cur.map_Ns = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Displ", 9) || !strncmp(token, "Displ_map", 9)) {
          parseSep(token += 9);
          cur.map_Displ = loadTexture(FileName(token));
          continue;
        }
        
        if (!strncmp(token, "Ka", 2)) { parseSep(token += 2);  cur.Ka = getVec3f(token); continue; }
        if (!strncmp(token, "Kd", 2)) { parseSep(token += 2);  cur.Kd = getVec3f(token); continue; }
        if (!strncmp(token, "Ks", 2)) { parseSep(token += 2);  cur.Ks = getVec3f(token); continue; }
        if (!strncmp(token, "Kt", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "Tf", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        
        /* extended OBJ */
        if (!strncmp(token, "type", 4)) {
          parseSep(token += 4); std::string type = token;
          if      (type == "matte") cur.type = ExtObjMaterial::MATTE;
          else if (type == "glass") cur.type = ExtObjMaterial::GLASS;
          else if (type == "metal") cur.type = ExtObjMaterial::METAL;
          else if (type == "metallicPaint") cur.type = ExtObjMaterial::METALLIC_PAINT;
          else if (type == "principled") cur.type = ExtObjMaterial::NONE;
          else if (type == "luminous") cur.type = ExtObjMaterial::NONE;
          continue;
        }

        /* OSPRay principled material extensions */
        if (!strncmp(token, "baseColor",         9)) { parseSep(token +=  9); cur.Kd  = getVec3f(token); continue; }
        if (!strncmp(token, "ior",               3)) { parseSep(token +=  3); cur.Ni = getFloat(token); continue; }
        if (!strncmp(token, "map_baseColor",    13)) { parseSep(token += 13); cur.map_Kd = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_specular",     12)) { parseSep(token += 12); cur.map_Ks = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_normal.scale", 16)) { parseSep(token += 16); continue; }
        if (!strncmp(token, "map_normal",       10)) { parseSep(token += 10); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "transmissionColor",17)) { parseSep(token += 17); cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "transmission",     12)) { parseSep(token += 12); cur.Kt = Vec3f(getFloat(token)); continue; }
                
        if (!strncmp(token, "roughnessMap",     12)) { parseSep(token += 12); cur.roughnessMap = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "roughness",         9)) { parseSep(token +=  9); cur.roughness = getFloat(token); cur.Ns = 1.0f/(cur.roughness+1E-6f); continue; }
        if (!strncmp(token, "colorMap",          8)) { parseSep(token +=  8); cur.map_Kd  = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "color",             5)) { parseSep(token +=  5); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.color",       10)) { parseSep(token += 10); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.eta",          8)) { parseSep(token +=  8); cur.coat_eta  = getFloat(token); continue; }
        if (!strncmp(token, "coat.roughnessMap",17)) { parseSep(token += 17); cur.coat_roughnessMap   = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "coat.roughness",   14)) { parseSep(token += 14); cur.coat_roughness = getFloat(token); continue; }
        if (!strncmp(token, "bumpMap",           7)) { parseSep(token +=  7); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "bump",              4)) { parseSep(token +=  4); cur.bump   = getFloat(token); continue; }
        if (!strncmp(token, "eta",               3)) { parseSep(token +=  3); cur.eta = getVec3f(token); continue; }
        if (!strncmp(token, "k",                 1)) { parseSep(token +=  1); cur.k = getVec3f(token); continue; }
      } 
      catch (const std::runtime_error& e) {
        std::cerr << "Error: " << e.what() << std::endl;
      }
    }

    if (name != "") {
      material[name] = cur.select();
      material[name]->name = name;
    }

    cin.close();
  }